

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

Disk * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::Disk,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
          (polymorphic_allocator<std::byte> *this,Transform **args,Transform **args_1,bool *args_2,
          float *args_3,float *args_4,float *args_5,float *args_6)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x28,8);
  construct<pbrt::Disk,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
            (this,(Disk *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4,args_5,
             args_6);
  return (Disk *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }